

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::emplaceRealloc<>
          (SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg> *this,pointer pos)

{
  undefined8 *puVar1;
  ulong uVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  pointer paVar5;
  undefined4 uVar6;
  Arg *__cur_1;
  pointer pAVar7;
  pointer pAVar8;
  pointer pAVar9;
  pointer pAVar10;
  Arg *__cur;
  long lVar11;
  EVP_PKEY_CTX *ctx;
  EVP_PKEY_CTX *pEVar12;
  
  if (this->len == 0x333333333333333) {
    detail::throwLengthError();
  }
  pEVar12 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar2 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar2 * 2);
  if (pEVar12 < ctx) {
    pEVar12 = ctx;
  }
  if (0x333333333333333 - uVar2 < uVar2) {
    pEVar12 = (EVP_PKEY_CTX *)0x333333333333333;
  }
  lVar11 = (long)pos - (long)this->data_;
  pAVar7 = (pointer)operator_new((long)pEVar12 * 0x28);
  *(undefined8 *)((long)pAVar7 + lVar11) = 0;
  ((undefined8 *)((long)pAVar7 + lVar11))[1] = 0;
  puVar1 = (undefined8 *)((long)pAVar7 + lVar11 + 0x10);
  *puVar1 = 0;
  puVar1[1] = 0;
  *(undefined8 *)((long)pAVar7 + lVar11 + 0x20) = 0;
  pAVar10 = this->data_;
  pAVar8 = pAVar10 + this->len;
  pAVar9 = pAVar7;
  if (pAVar8 == pos) {
    for (; pAVar10 != pos; pAVar10 = pAVar10 + 1) {
      (pAVar9->edgeDescriptors)._M_extent._M_extent_value =
           (pAVar10->edgeDescriptors)._M_extent._M_extent_value;
      pEVar3 = pAVar10->expr;
      pEVar4 = pAVar10->condition;
      uVar6 = *(undefined4 *)&pAVar10->field_0x14;
      paVar5 = (pAVar10->edgeDescriptors)._M_ptr;
      pAVar9->edge = pAVar10->edge;
      *(undefined4 *)&pAVar9->field_0x14 = uVar6;
      (pAVar9->edgeDescriptors)._M_ptr = paVar5;
      pAVar9->expr = pEVar3;
      pAVar9->condition = pEVar4;
      pAVar9 = pAVar9 + 1;
    }
  }
  else {
    for (; pAVar10 != pos; pAVar10 = pAVar10 + 1) {
      ctx = (EVP_PKEY_CTX *)(pAVar10->edgeDescriptors)._M_extent._M_extent_value;
      (pAVar9->edgeDescriptors)._M_extent._M_extent_value = (size_t)ctx;
      pEVar3 = pAVar10->expr;
      pEVar4 = pAVar10->condition;
      uVar6 = *(undefined4 *)&pAVar10->field_0x14;
      paVar5 = (pAVar10->edgeDescriptors)._M_ptr;
      pAVar9->edge = pAVar10->edge;
      *(undefined4 *)&pAVar9->field_0x14 = uVar6;
      (pAVar9->edgeDescriptors)._M_ptr = paVar5;
      pAVar9->expr = pEVar3;
      pAVar9->condition = pEVar4;
      pAVar9 = pAVar9 + 1;
    }
    puVar1 = (undefined8 *)((long)pAVar7 + lVar11);
    for (; pos != pAVar8; pos = pos + 1) {
      puVar1[9] = (pos->edgeDescriptors)._M_extent._M_extent_value;
      pEVar3 = pos->expr;
      pEVar4 = pos->condition;
      paVar5 = (pos->edgeDescriptors)._M_ptr;
      puVar1[7] = *(undefined8 *)&pos->edge;
      puVar1[8] = paVar5;
      puVar1[5] = pEVar3;
      puVar1[6] = pEVar4;
      puVar1 = puVar1 + 5;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar12;
  this->data_ = pAVar7;
  return (pointer)((long)pAVar7 + lVar11);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}